

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void __thiscall nivalis::Plotter::populate_grid(Plotter *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  pointer *ppPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer puVar7;
  pointer puVar8;
  iterator __position;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  pointer pDVar15;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *pvVar16;
  anon_class_24_3_02951b27 *paVar17;
  long lVar18;
  pointer pDVar19;
  long lVar20;
  pointer pPVar21;
  pointer paVar22;
  pointer pPVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *this_01;
  anon_class_24_3_02951b27 *this_02;
  int iVar28;
  pointer pDVar29;
  unsigned_long uVar30;
  ulong uVar31;
  long *in_FS_OFFSET;
  double dVar32;
  int iVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  size_t hi;
  anon_class_24_3_02951b27 bfs;
  size_t lo;
  size_t local_a8;
  ulong local_a0;
  vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *local_98;
  pointer local_90;
  anon_class_24_3_02951b27 local_88;
  PointMarker local_70;
  size_t local_38;
  
  this_00 = &this->grid;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_00,(long)(this->view).shigh * (long)(this->view).swid);
  puVar7 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar8 = (this->grid).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar7 != puVar8) {
    memset(puVar7,0xff,((long)puVar8 + (-8 - (long)puVar7) & 0xfffffffffffffff8U) + 8);
  }
  if ((char)in_FS_OFFSET[-0x8f] == '\0') {
    populate_grid();
  }
  this_01 = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
            (*in_FS_OFFSET + -0x490);
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
            (this_01,(long)(this->view).shigh * (long)(this->view).swid);
  local_88.lo = &local_38;
  local_38 = 0;
  local_a8 = 0;
  pPVar21 = (this->pt_markers).
            super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar23 = (this->pt_markers).
            super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pPVar23 != pPVar21) {
    lVar14 = 0x30;
    pvVar16 = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0;
    do {
      if ((*(char *)((long)&pPVar21->x + lVar14) == '\0') &&
         ((*(long *)((long)pPVar21 + lVar14 + -0x10) != -1 ||
          (*(long *)((long)pPVar21 + lVar14 + -8) != -1)))) {
        dVar32 = (this->view).ymax;
        dVar4 = (this->view).xmin;
        uVar2 = (this->view).swid;
        uVar5 = (this->view).shigh;
        auVar39._0_8_ = (double)(int)uVar5 * (dVar32 - *(double *)((long)pPVar21 + lVar14 + -0x28));
        auVar39._8_8_ = (double)(int)uVar2 * (*(double *)((long)pPVar21 + lVar14 + -0x30) - dVar4);
        dVar4 = (this->view).xmax - dVar4;
        auVar40._8_4_ = SUB84(dVar4,0);
        auVar40._0_8_ = dVar32 - (this->view).ymin;
        auVar40._12_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar40 = divpd(auVar39,auVar40);
        iVar36 = (int)((float)auVar40._0_8_ + 0.5);
        iVar37 = (int)((float)auVar40._8_8_ + 0.5);
        auVar12._4_4_ = -(uint)(-1 < iVar36);
        auVar12._0_4_ = -(uint)(-1 < iVar37);
        auVar12._8_4_ = -(uint)(iVar37 < (int)uVar2);
        auVar12._12_4_ = -(uint)(iVar36 < (int)uVar5);
        iVar25 = movmskps((int)this_01,auVar12);
        if (iVar25 == 0xf) {
          uVar26 = iVar37 + uVar2 * iVar36;
          puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar7[uVar26] == 0xffffffffffffffff) {
            puVar7[(int)uVar26] = (unsigned_long)pvVar16;
            lVar18 = in_FS_OFFSET[-0x92];
            lVar20 = local_a8 * 0x10;
            *(ulong *)(lVar18 + lVar20) = CONCAT44(iVar37,iVar36);
            *(int *)(lVar18 + 8 + lVar20) = (int)pvVar16;
            *(undefined4 *)(lVar18 + 0xc + lVar20) = 0;
            pPVar21 = (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar23 = (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_a8 = local_a8 + 1;
          }
        }
      }
      pvVar16 = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                ((long)&(pvVar16->
                        super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
      this_01 = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                (((long)pPVar23 - (long)pPVar21 >> 3) * 0x6db6db6db6db6db7);
      lVar14 = lVar14 + 0x38;
    } while (pvVar16 < this_01);
  }
  this_02 = &local_88;
  local_88.hi = &local_a8;
  local_88.this = this;
  populate_grid::anon_class_24_3_02951b27::operator()(this_02);
  pPVar21 = (this->pt_markers).
            super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar23 = (this->pt_markers).
            super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pPVar23 != pPVar21) {
    lVar14 = 0x30;
    paVar17 = (anon_class_24_3_02951b27 *)0x0;
    do {
      if (((*(char *)((long)&pPVar21->x + lVar14) == '\0') &&
          (*(long *)((long)pPVar21 + lVar14 + -0x10) == -1)) &&
         (*(long *)((long)pPVar21 + lVar14 + -8) == -1)) {
        dVar32 = (this->view).ymax;
        dVar4 = (this->view).xmin;
        uVar3 = (this->view).swid;
        uVar6 = (this->view).shigh;
        auVar41._0_8_ = (double)(int)uVar6 * (dVar32 - *(double *)((long)pPVar21 + lVar14 + -0x28));
        auVar41._8_8_ = (double)(int)uVar3 * (*(double *)((long)pPVar21 + lVar14 + -0x30) - dVar4);
        dVar4 = (this->view).xmax - dVar4;
        auVar10._8_4_ = SUB84(dVar4,0);
        auVar10._0_8_ = dVar32 - (this->view).ymin;
        auVar10._12_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar40 = divpd(auVar41,auVar10);
        iVar36 = (int)((float)auVar40._0_8_ + 0.5);
        iVar37 = (int)((float)auVar40._8_8_ + 0.5);
        auVar13._4_4_ = -(uint)(-1 < iVar36);
        auVar13._0_4_ = -(uint)(-1 < iVar37);
        auVar13._8_4_ = -(uint)(iVar37 < (int)uVar3);
        auVar13._12_4_ = -(uint)(iVar36 < (int)uVar6);
        iVar25 = movmskps((int)this_02,auVar13);
        if (iVar25 == 0xf) {
          uVar26 = iVar37 + uVar3 * iVar36;
          puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (puVar7[uVar26] == 0xffffffffffffffff) {
            puVar7[(int)uVar26] = (unsigned_long)paVar17;
            lVar18 = in_FS_OFFSET[-0x92];
            lVar20 = local_a8 * 0x10;
            *(ulong *)(lVar18 + lVar20) = CONCAT44(iVar37,iVar36);
            *(int *)(lVar18 + 8 + lVar20) = (int)paVar17;
            *(undefined4 *)(lVar18 + 0xc + lVar20) = 0;
            pPVar21 = (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pPVar23 = (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_a8 = local_a8 + 1;
          }
        }
      }
      paVar17 = (anon_class_24_3_02951b27 *)((long)&paVar17->lo + 1);
      this_02 = (anon_class_24_3_02951b27 *)
                (((long)pPVar23 - (long)pPVar21 >> 3) * 0x6db6db6db6db6db7);
      lVar14 = lVar14 + 0x38;
    } while (paVar17 < this_02);
  }
  populate_grid::anon_class_24_3_02951b27::operator()(&local_88);
  pDVar15 = (this->draw_buf).
            super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar19 = (this->draw_buf).
            super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar19 != pDVar15) {
    local_98 = &this->pt_markers;
    uVar24 = 0;
    do {
      if (pDVar15[uVar24].type == POLYLINE) {
        pDVar29 = pDVar15 + uVar24;
        paVar22 = (pDVar29->points).
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0x10 < (ulong)((long)(pDVar29->points).
                                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar22)) {
          uVar31 = 1;
          local_a0 = uVar24;
          local_90 = pDVar29;
          do {
            __position._M_current =
                 (this->pt_markers).
                 super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            pPVar21 = (this->pt_markers).
                      super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_70.x = paVar22[uVar31 - 1]._M_elems[0];
            local_70.y = paVar22[uVar31 - 1]._M_elems[1];
            local_70.label = LABEL_NONE;
            local_70.rel_func = pDVar29->rel_func;
            local_70.passive = true;
            local_70.drag_var_x._0_4_ = 0xffffffff;
            local_70.drag_var_x._4_4_ = 0xffffffff;
            local_70.drag_var_y._0_4_ = 0xffffffff;
            local_70.drag_var_y._4_4_ = 0xffffffff;
            if (__position._M_current ==
                (this->pt_markers).
                super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
              _M_realloc_insert<nivalis::PointMarker>(local_98,__position,&local_70);
              pDVar29 = local_90;
            }
            else {
              *(ulong *)&(__position._M_current)->passive = CONCAT71(local_70._49_7_,1);
              (__position._M_current)->drag_var_x = 0xffffffffffffffff;
              (__position._M_current)->drag_var_y = 0xffffffffffffffff;
              *(ulong *)&(__position._M_current)->label = (ulong)(uint)local_70._20_4_ << 0x20;
              (__position._M_current)->rel_func = local_70.rel_func;
              (__position._M_current)->x = local_70.x;
              (__position._M_current)->y = local_70.y;
              ppPVar1 = &(this->pt_markers).
                         super__Vector_base<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar1 = *ppPVar1 + 1;
            }
            paVar22 = paVar22 + uVar31;
            iVar25 = (this->view).swid;
            dVar32 = (double)iVar25;
            dVar4 = (this->view).xmin;
            auVar38._0_8_ = (this->view).xmax - dVar4;
            auVar33._0_8_ = dVar32 * (paVar22->_M_elems[0] - dVar4);
            auVar33._8_8_ = dVar32 * (paVar22[-1]._M_elems[0] - dVar4);
            auVar38._8_8_ = auVar38._0_8_;
            auVar40 = divpd(auVar33,auVar38);
            iVar36 = (int)((float)auVar40._8_8_ + 0.5);
            if (((-1 < iVar36) && (iVar36 < iVar25)) &&
               ((int)((float)auVar40._0_8_ + 0.5) - iVar36 < 2)) {
              iVar25 = (this->view).shigh;
              dVar4 = (this->view).ymax;
              auVar34._0_8_ = (double)iVar25 * (dVar4 - paVar22[-1]._M_elems[1]);
              auVar34._8_8_ = (double)iVar25 * (dVar4 - paVar22->_M_elems[1]);
              dVar4 = dVar4 - (this->view).ymin;
              auVar11._8_4_ = SUB84(dVar4,0);
              auVar11._0_8_ = dVar4;
              auVar11._12_4_ = (int)((ulong)dVar4 >> 0x20);
              auVar40 = divpd(auVar34,auVar11);
              iVar37 = (int)((float)auVar40._0_8_ + 0.5);
              iVar35 = (int)((float)auVar40._8_8_ + 0.5);
              bVar9 = iVar37 <= iVar35;
              if (iVar37 < 1) {
                iVar37 = 0;
              }
              iVar27 = iVar25 + -1;
              if (iVar27 < iVar37) {
                iVar37 = iVar27;
              }
              if (iVar35 < 1) {
                iVar35 = 0;
              }
              if (iVar35 <= iVar27) {
                iVar27 = iVar35;
              }
              if (iVar37 != iVar27 + (uint)bVar9 * 2 + -1) {
                uVar30 = ((long)__position._M_current - (long)pPVar21 >> 3) * 0x6db6db6db6db6db7;
                iVar27 = (uint)bVar9 * 2 + -1;
                do {
                  iVar28 = (this->view).swid * iVar37 + iVar36;
                  puVar7 = (this->grid).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  if (puVar7[iVar28] == 0xffffffffffffffff) {
                    puVar7[iVar28] = uVar30;
                    lVar14 = in_FS_OFFSET[-0x92];
                    lVar18 = local_a8 * 0x10;
                    *(int *)(lVar14 + lVar18) = iVar37;
                    *(int *)(lVar14 + 4 + lVar18) = iVar36;
                    *(int *)(lVar14 + 8 + lVar18) = (int)uVar30;
                    *(undefined4 *)(lVar14 + 0xc + lVar18) = 0;
                    iVar25 = (this->view).shigh;
                    local_a8 = local_a8 + 1;
                  }
                  iVar37 = iVar37 + iVar27;
                  iVar28 = iVar25 + -1;
                  if (iVar35 <= iVar25 + -1) {
                    iVar28 = iVar35;
                  }
                } while (iVar37 - iVar27 != iVar28);
              }
            }
            uVar31 = uVar31 + 1;
            paVar22 = (pDVar29->points).
                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar31 < (ulong)((long)(pDVar29->points).
                                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)paVar22
                                   >> 4));
          pDVar15 = (this->draw_buf).
                    super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar19 = (this->draw_buf).
                    super__Vector_base<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          uVar24 = local_a0;
        }
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 < (ulong)((long)pDVar19 - (long)pDVar15 >> 7));
  }
  populate_grid::anon_class_24_3_02951b27::operator()(&local_88);
  return;
}

Assistant:

void Plotter::populate_grid() {
    const int r = marker_clickable_radius;
    grid.resize(view.swid * view.shigh);
    std::fill(grid.begin(), grid.end(), -1);

    thread_local std::vector<
            std::array<int, 4> // y x id dist
            > que;
    que.resize(view.swid * view.shigh);

    size_t lo = 0, hi = 0;
    auto bfs = [&]{
        // BFS to fill grid
        while(lo < hi) {
            const auto& v = que[lo++];
            int sy = v[0], sx = v[1], id = v[2], d = v[3];
            if (d >= marker_clickable_radius) continue;
            if (sy > 0 && grid[(sy - 1) * view.swid + sx] == -1) {
                que[hi++] = { sy - 1, sx, id, d + 1};
                grid[(sy - 1) * view.swid + sx] = id;
            }
            if (sx > 0 && grid[sy * view.swid + sx - 1] == -1) {
                que[hi++] = { sy, sx - 1, id, d + 1};
                grid[sy * view.swid + sx - 1] = id;
            }
            if (sx < view.swid - 1 && grid[sy * view.swid + sx + 1] == -1) {
                que[hi++] = { sy, sx + 1, id, d + 1};
                grid[sy * view.swid + sx + 1] = id;
            }
            if (sy < view.shigh - 1 && grid[(sy + 1) * view.swid + sx] == -1) {
                que[hi++] = { sy + 1, sx, id, d + 1};
                grid[(sy + 1) * view.swid + sx] = id;
            }
        }
    };

    // Pass 1: BFS from draggable markers
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || (ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 2: BFS from non-draggable, active (i.e. text-on-hover) markers
    // only goes through grid cells not already visited
    for (size_t id = 0; id < pt_markers.size(); ++id) {
        auto& ptm = pt_markers[id];
        if (ptm.passive || !(ptm.drag_var_x == -1 && ptm.drag_var_y == -1)) continue;
        int sx = (int)(0.5 + _X_TO_SX(ptm.x));
        int sy = (int)(0.5 + _Y_TO_SY(ptm.y));
        if (sx < 0 || sy < 0 || sx >= view.swid || sy >= view.shigh)
            continue;
        if (~grid[sy * view.swid + sx]) continue;
        grid[sy * view.swid + sx] = id;
        que[hi++] = { sy, sx, (int)id, 0 };
    }
    bfs();
    // Note: hi will be 0 here;

    // Pass 3: Construct and push passive markers (for clicking on functions)
    for (size_t i = 0; i < draw_buf.size(); ++i) {
        const auto & obj = draw_buf[i];
        if (obj.type == DrawBufferObject::POLYLINE) {
            const auto& points = obj.points;
            for (size_t j = 1; j < points.size(); ++j) {
                const std::array<double, 2>& p = points[j - 1];
                const std::array<double, 2>& q = points[j];
                size_t id = pt_markers.size();
                {
                    PointMarker ptm;
                    ptm.x = p[0]; ptm.y = p[1];
                    ptm.label = PointMarker::LABEL_NONE;
                    ptm.rel_func = obj.rel_func;
                    ptm.passive = true;
                    ptm.drag_var_x = ptm.drag_var_y = -1;
                    pt_markers.push_back(std::move(ptm));
                }
                int psx = (int)(0.5 + _X_TO_SX(p[0]));
                int qsx = (int)(0.5 + _X_TO_SX(q[0]));
                if (psx < 0 || psx >= view.swid || qsx - psx > 1) continue;

                int psy = (int)(0.5 + _Y_TO_SY(p[1]));
                int qsy = (int)(0.5 + _Y_TO_SY(q[1]));
                int dir = qsy >= psy ? 1 : -1;
                for (int r = std::min(std::max(psy, 0), view.shigh - 1);
                        r != std::min(std::max(qsy, 0), view.shigh - 1) + dir; r += dir) {
                    if (~grid[r * view.swid + psx]) continue;
                    grid[r * view.swid + psx] = id;
                    que[hi++] = { r, psx, (int)id, 0 };
                }
            }
        }
    }
    bfs();
}